

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxBoolCast::Emit(FxBoolCast *this,VMFunctionBuilder *build)

{
  byte bVar1;
  uint uVar2;
  ExpEmit EVar3;
  ulong uVar4;
  int opc;
  char cVar5;
  ExpEmit EVar6;
  ExpEmit from;
  uint extraout_var;
  
  EVar3._0_4_ = (*this->basex->_vptr_FxExpression[9])();
  EVar3.Konst = (bool)(char)extraout_var;
  EVar3.Fixed = (bool)(char)(extraout_var >> 8);
  EVar3.Final = (bool)(char)(extraout_var >> 0x10);
  EVar3.Target = (bool)(char)(extraout_var >> 0x18);
  from = EVar3;
  if ((extraout_var & 1) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x327,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
  }
  bVar1 = this->basex->ValueType->RegType;
  if ((bVar1 < 4) && (bVar1 != 2)) {
    if (this->NeedValue == true) {
      uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
      EVar6.Konst = false;
      EVar6.Fixed = false;
      EVar6.Final = false;
      EVar6.Target = false;
      EVar6.RegNum = (short)uVar2;
      EVar6.RegType = (char)(uVar2 >> 0x10);
      EVar6.RegCount = (char)(uVar2 >> 0x18);
      ExpEmit::Free(&from,build);
      cVar5 = (char)(EVar3._0_4_ >> 0x10);
      opc = 0x14;
      if (cVar5 != '\0') {
        opc = (cVar5 != '\x01') + 0x15;
      }
      VMFunctionBuilder::Emit(build,0x3f,uVar2 & 0xffff,EVar3._0_4_ & 0xffff,opc);
      uVar4 = 0x1000000;
      EVar3 = EVar6;
    }
    else {
      uVar4 = (ulong)EVar3 & 0xfffffffeffff0000;
    }
    return (ExpEmit)((ulong)EVar3 & 0xffff | uVar4);
  }
  __assert_fail("basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x328,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxBoolCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER);

	if (NeedValue)
	{
		ExpEmit to(build, REGT_INT);
		from.Free(build);
		build->Emit(OP_CASTB, to.RegNum, from.RegNum, from.RegType == REGT_INT ? CASTB_I : from.RegType == REGT_FLOAT ? CASTB_F : CASTB_A);
		return to;
	}
	else
	{
		return from;
	}
}